

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

int VP8LBackwardReferencesTraceBackwards
              (int xsize,int ysize,uint32_t *argb,int cache_bits,VP8LHashChain *hash_chain,
              VP8LBackwardRefs *refs_src,VP8LBackwardRefs *refs_dst)

{
  int iVar1;
  uint16_t *dist_array_00;
  int in_ESI;
  int in_EDI;
  VP8LBackwardRefs *in_stack_00000008;
  uint16_t *dist_array;
  int chosen_path_size;
  uint16_t *chosen_path;
  int dist_array_size;
  int ok;
  size_t in_stack_ffffffffffffffb0;
  uint64_t in_stack_ffffffffffffffb8;
  int local_3c;
  uint16_t *local_38;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  local_30 = in_EDI * in_ESI;
  local_38 = (uint16_t *)0x0;
  local_3c = 0;
  dist_array_00 = (uint16_t *)WebPSafeMalloc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if ((dist_array_00 != (uint16_t *)0x0) &&
     (iVar1 = BackwardReferencesHashChainDistanceOnly
                        (xsize,ysize,argb,cache_bits,hash_chain,refs_src,(uint16_t *)refs_dst),
     iVar1 != 0)) {
    TraceBackwards(dist_array_00,local_30,&local_38,&local_3c);
    iVar1 = BackwardReferencesHashChainFollowChosenPath
                      ((uint32_t *)refs_src,ok,chosen_path,chosen_path_size,
                       (VP8LHashChain *)dist_array,in_stack_00000008);
    if (iVar1 != 0) {
      local_2c = 1;
    }
  }
  WebPSafeFree((void *)0x1a285a);
  return local_2c;
}

Assistant:

int VP8LBackwardReferencesTraceBackwards(int xsize, int ysize,
                                         const uint32_t* const argb,
                                         int cache_bits,
                                         const VP8LHashChain* const hash_chain,
                                         const VP8LBackwardRefs* const refs_src,
                                         VP8LBackwardRefs* const refs_dst) {
  int ok = 0;
  const int dist_array_size = xsize * ysize;
  uint16_t* chosen_path = NULL;
  int chosen_path_size = 0;
  uint16_t* dist_array =
      (uint16_t*)WebPSafeMalloc(dist_array_size, sizeof(*dist_array));

  if (dist_array == NULL) goto Error;

  if (!BackwardReferencesHashChainDistanceOnly(
          xsize, ysize, argb, cache_bits, hash_chain, refs_src, dist_array)) {
    goto Error;
  }
  TraceBackwards(dist_array, dist_array_size, &chosen_path, &chosen_path_size);
  if (!BackwardReferencesHashChainFollowChosenPath(
          argb, cache_bits, chosen_path, chosen_path_size, hash_chain,
          refs_dst)) {
    goto Error;
  }
  ok = 1;
 Error:
  WebPSafeFree(dist_array);
  return ok;
}